

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O1

int __thiscall xscript::parser::ast::operator_precedence(ast *this,token_t t)

{
  int iVar1;
  
  iVar1 = -1;
  if (t - TK_ADD < 0x2c) {
    iVar1 = *(int *)(&DAT_0012c728 + (ulong)(t - TK_ADD) * 4);
  }
  return iVar1;
}

Assistant:

int ast::operator_precedence(tokenizer::token_t t) {
    switch (t) {
        case tokenizer::TK_LEFT_PAREN: // ()
        case tokenizer::TK_LEFT_BRACK: // []
            return 0;
        case tokenizer::TK_DOT:
        case tokenizer::TK_RIGHT_ARROW:
            return 1;
        // case 单目运算符:
        //     return 2;
        case tokenizer::TK_MUL:
        case tokenizer::TK_DIV:
        case tokenizer::TK_MOD:
            return 3;
        case tokenizer::TK_ADD:
        case tokenizer::TK_SUB:
            return 4;
        case tokenizer::TK_BITWISE_SHL:
        case tokenizer::TK_BITWISE_SHR:
            return 5;
        case tokenizer::TK_GREATER:
        case tokenizer::TK_LESS:
        case tokenizer::TK_GREATER_EQUAL:
        case tokenizer::TK_LESS_EQUAL:
            return 6;
        case tokenizer::TK_EQUAL:
        case tokenizer::TK_NOT_EQUAL:
            return 7;
        case tokenizer::TK_BITWISE_AND:
            return 8;
        case tokenizer::TK_BITWISE_XOR:
            return 9;
        case tokenizer::TK_BITWISE_OR:
            return 10;
        case tokenizer::TK_LOGIC_AND:
            return 11;
        case tokenizer::TK_LOGIC_OR:
            return 12;
        //case '?':
        //    return 13;
        case tokenizer::TK_ASSIGN:
        case tokenizer::TK_ASSIGN_ADD:
        case tokenizer::TK_ASSIGN_SUB:
        case tokenizer::TK_ASSIGN_MUL:
        case tokenizer::TK_ASSIGN_DIV:
        case tokenizer::TK_ASSIGN_MOD:
        case tokenizer::TK_ASSIGN_AND:
        case tokenizer::TK_ASSIGN_OR:
        case tokenizer::TK_ASSIGN_XOR:
        case tokenizer::TK_ASSIGN_SHL:
        case tokenizer::TK_ASSIGN_SHR:
            return 14;
        default:
            return -1;
    }
}